

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O1

void rapidjson::internal::Grisu2(double value,char *buffer,int *length,int *K)

{
  long lVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  DiyFp DVar5;
  DiyFp local_98;
  DiyFp local_88;
  undefined1 local_78 [8];
  DiyFp w_m;
  DiyFp w_p;
  DiyFp local_48;
  int *local_38;
  
  local_48.f = (ulong)value & 0xfffffffffffff;
  if (((ulong)value >> 0x34 & 0x7ff) == 0) {
    local_48.e = -0x432;
  }
  else {
    local_48.f = local_48.f + 0x10000000000000;
    local_48.e = ((uint)((ulong)value >> 0x34) & 0x7ff) - 0x433;
  }
  local_78 = (undefined1  [8])0x0;
  w_m.f._0_4_ = 0;
  w_m.e = 0;
  w_m._12_4_ = 0;
  w_p.f._0_4_ = 0;
  local_38 = length;
  DiyFp::NormalizedBoundaries(&local_48,(DiyFp *)local_78,(DiyFp *)&w_m.e);
  dVar2 = (double)(-0x3d - (int)w_p.f) * 0.30102999566398114 + 347.0;
  iVar4 = (int)((uint)((double)(int)dVar2 < dVar2) + (int)dVar2) >> 3;
  uVar3 = iVar4 + 1;
  *K = 0x15c - (iVar4 * 8 + 8);
  if (uVar3 < 0x57) {
    local_98.f = *(uint64_t *)
                  (GetCachedPowerByIndex(unsigned_long)::kCachedPowers_F + (ulong)uVar3 * 8);
    local_98.e = (int)*(short *)(GetCachedPowerByIndex(unsigned_long)::kCachedPowers_E +
                                (ulong)uVar3 * 2);
    DVar5 = DiyFp::Normalize(&local_48);
    w_p._8_8_ = DVar5.f;
    DVar5 = DiyFp::operator*((DiyFp *)&w_p.e,&local_98);
    local_88.f = DVar5.f;
    local_88.e = DVar5.e;
    DVar5 = DiyFp::operator*((DiyFp *)&w_m.e,&local_98);
    w_p._8_8_ = DVar5.f;
    DVar5 = DiyFp::operator*((DiyFp *)local_78,&local_98);
    lVar1 = w_p._8_8_ + -1;
    w_p._8_8_ = w_p._8_8_ + -1;
    DigitGen(&local_88,(DiyFp *)&w_p.e,lVar1 + ~DVar5.f,buffer,local_38,K);
    return;
  }
  __assert_fail("index < 87",
                "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/internal/diyfp.h"
                ,0xdc,"DiyFp rapidjson::internal::GetCachedPowerByIndex(size_t)");
}

Assistant:

inline void Grisu2(double value, char* buffer, int* length, int* K) {
    const DiyFp v(value);
    DiyFp w_m, w_p;
    v.NormalizedBoundaries(&w_m, &w_p);

    const DiyFp c_mk = GetCachedPower(w_p.e, K);
    const DiyFp W = v.Normalize() * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DigitGen(W, Wp, Wp.f - Wm.f, buffer, length, K);
}